

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

MPP_RET read_with_pixel_width
                  (RK_U8 *buf,RK_S32 width,RK_S32 height,RK_S32 hor_stride,RK_S32 pix_w,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  MPP_RET MVar4;
  ulong uVar5;
  
  iVar3 = pix_w * width;
  if (hor_stride < iVar3) {
    _mpp_log_l(2,"utils",
               "invalid %dbit color config: hor_stride %d is smaller then width %d multiply by 4\n",
               "read_with_pixel_width",pix_w * 8,hor_stride,width,pix_w);
    _mpp_log_l(2,"utils","width  should be defined by pixel count\n","read_with_pixel_width");
    _mpp_log_l(2,"utils","stride should be defined by byte count\n","read_with_pixel_width");
    hor_stride = iVar3;
  }
  if (height < 1) {
    MVar4 = MPP_OK;
  }
  else {
    uVar5 = (ulong)(uint)height;
    MVar4 = MPP_OK;
    do {
      uVar5 = uVar5 - 1;
      sVar2 = fread(buf,1,(long)iVar3,(FILE *)fp);
      iVar1 = feof((FILE *)fp);
      if (iVar1 == 0) {
        if (iVar3 != (int)sVar2) {
          _mpp_log_l(2,"utils","read file failed expect %d vs %d\n","read_with_pixel_width",iVar3,
                     sVar2 & 0xffffffff);
          goto LAB_001089dd;
        }
      }
      else {
LAB_001089dd:
        MVar4 = MPP_NOK;
      }
    } while ((iVar1 == 0) && (buf = buf + hor_stride, uVar5 != 0));
  }
  return MVar4;
}

Assistant:

static MPP_RET read_with_pixel_width(RK_U8 *buf, RK_S32 width, RK_S32 height,
                                     RK_S32 hor_stride, RK_S32 pix_w, FILE *fp)
{
    RK_S32 row;
    MPP_RET ret = MPP_OK;

    if (hor_stride < width * pix_w) {
        mpp_err_f("invalid %dbit color config: hor_stride %d is smaller then width %d multiply by 4\n",
                  8 * pix_w, hor_stride, width, pix_w);
        mpp_err_f("width  should be defined by pixel count\n");
        mpp_err_f("stride should be defined by byte count\n");

        hor_stride = width * pix_w;
    }

    for (row = 0; row < height; row++) {
        RK_S32 read_size = fread(buf + row * hor_stride, 1, width * pix_w, fp);
        if (feof(fp)) {
            ret = MPP_NOK;
            break;
        }
        if (read_size != width * pix_w) {
            mpp_err_f("read file failed expect %d vs %d\n",
                      width * pix_w, read_size);
            ret = MPP_NOK;
        }
    }

    return ret;
}